

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_acolyte.cpp
# Opt level: O1

int AF_A_AcolyteDie(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DThinker *pDVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  PClass *pPVar6;
  undefined4 extraout_var_00;
  int *piVar7;
  PClass *pPVar8;
  DThinker *pDVar9;
  uint uVar10;
  VMValue *pVVar11;
  char *__assertion;
  ulong uVar12;
  bool bVar13;
  TThinkerIterator<AActor> iterator;
  FSoundID local_44;
  FThinkerIterator local_40;
  
  pPVar8 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c952f;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    pDVar2 = (DThinker *)(param->field_0).field_1.a;
    pVVar11 = param;
    uVar10 = numparam;
    if (pDVar2 != (DThinker *)0x0) {
      if ((pDVar2->super_DObject).Class == (PClass *)0x0) {
        iVar4 = (**(pDVar2->super_DObject)._vptr_DObject)(pDVar2);
        (pDVar2->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar6 = (pDVar2->super_DObject).Class;
      bVar13 = pPVar6 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar13;
      uVar10 = (uint)bVar13;
      pVVar11 = (VMValue *)(ulong)(pPVar6 == pPVar8 || bVar13);
      if (pPVar6 != pPVar8 && !bVar13) {
        do {
          pPVar6 = pPVar6->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
          if (pPVar6 == pPVar8) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c952f;
      }
    }
    pPVar8 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005c9504;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar5 = (**(code **)*puVar3)(puVar3,pVVar11,uVar10,ret);
          puVar3[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar3[1];
        bVar13 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar8 && bVar13) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar13 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar8) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar13) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c952f;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      *(FRenderStyle *)&pDVar2[4].super_DObject.Class = LegacyRenderStyles[1];
      if ((pDVar2->super_DObject).Class == (PClass *)0x0) {
        iVar4 = (**(pDVar2->super_DObject)._vptr_DObject)(pDVar2);
        (pDVar2->super_DObject).Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
      }
      if ((((pDVar2->super_DObject).Class)->super_PStruct).super_PNamedType.TypeName.Index == 0x74)
      {
        piVar7 = &DAT_00a39328;
        uVar12 = 0;
        do {
          if ((playeringame[uVar12] == true) && (0 < *piVar7)) goto LAB_005c9431;
          uVar12 = uVar12 + 1;
          piVar7 = piVar7 + 0xa8;
        } while (uVar12 != 8);
        uVar12 = 8;
LAB_005c9431:
        if ((int)uVar12 != 8) {
          local_40.m_ParentType._0_4_ = 0x74;
          pPVar8 = PClass::FindClass((FName *)&local_40);
          FThinkerIterator::FThinkerIterator(&local_40,pPVar8,0x80);
          pDVar9 = FThinkerIterator::Next(&local_40);
          if (pDVar9 != (DThinker *)0x0) {
            do {
              if ((pDVar9 != pDVar2) && (0 < *(int *)((long)&pDVar9[8].super_DObject.Class + 4))) {
                return 0;
              }
              pDVar9 = FThinkerIterator::Next(&local_40);
            } while (pDVar9 != (DThinker *)0x0);
          }
          AActor::GiveInventoryType
                    ((AActor *)(&players)[(uVar12 & 0xffffffff) * 0x54],QuestItemClasses[6]);
          player_t::SetLogNumber((player_t *)(&players + (uVar12 & 0xffffffff) * 0x54),0xe);
          S_StopSound(2);
          local_44.ID = S_FindSound("svox/voc14");
          S_Sound(2,&local_44,1.0,1.0);
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005c9504:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005c952f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                ,0x30,"int AF_A_AcolyteDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_AcolyteDie)
{
	PARAM_ACTION_PROLOGUE;

	int i;

	// [RH] Disable translucency here.
	self->RenderStyle = STYLE_Normal;

	// Only the Blue Acolyte does extra stuff on death.
	if (self->GetClass()->TypeName != NAME_AcolyteBlue)
		return 0;

	// Make sure somebody is still alive
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i] && players[i].health > 0)
			break;
	}
	if (i == MAXPLAYERS)
		return 0;

	// Make sure all the other blue acolytes are dead.
	TThinkerIterator<AActor> iterator(NAME_AcolyteBlue);
	AActor *other;

	while ( (other = iterator.Next ()) )
	{
		if (other != self && other->health > 0)
		{ // Found a living one
			return 0;
		}
	}

	players[i].mo->GiveInventoryType (QuestItemClasses[6]);
	players[i].SetLogNumber (14);
	S_StopSound (CHAN_VOICE);
	S_Sound (CHAN_VOICE, "svox/voc14", 1, ATTN_NORM);
	return 0;
}